

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int function_addrs_search(void *vkey,void *ventry)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*ventry <= *vkey) {
    uVar1 = (uint)(*(ulong *)((long)ventry + 0x18) < *vkey);
  }
  return uVar1;
}

Assistant:

static int
function_addrs_search (const void *vkey, const void *ventry)
{
  const uintptr_t *key = (const uintptr_t *) vkey;
  const struct function_addrs *entry = (const struct function_addrs *) ventry;
  uintptr_t pc;

  pc = *key;
  if (pc < entry->low)
    return -1;
  else if (pc > (entry + 1)->low)
    return 1;
  else
    return 0;
}